

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void cxxopts::values::parse_value<std::__cxx11::string>
               (string *text,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  istream *piVar1;
  long local_1f8;
  stringstream in;
  byte abStack_1d8 [360];
  size_type *local_70;
  string token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1f8,(string *)text,_S_out|_S_in);
  local_70 = &token._M_string_length;
  token._M_dataplus._M_p = (pointer)0x0;
  token._M_string_length._0_1_ = 0;
  __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (token.field_2._M_local_buf + 8);
  while ((abStack_1d8[*(long *)(local_1f8 + -0x18)] & 2) == 0) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_1f8,(string *)&local_70,',');
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    v._M_dataplus._M_p = (pointer)0x0;
    v._M_string_length._0_1_ = 0;
    token.field_2._8_8_ = &v._M_string_length;
    std::__cxx11::string::_M_assign((string *)__args);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)value,__args);
    std::__cxx11::string::~string((string *)__args);
  }
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1f8);
  return;
}

Assistant:

void
    parse_value(const std::string& text, std::vector<T>& value)
    {
      std::stringstream in(text);
      std::string token;
      while(!in.eof() && std::getline(in, token, CXXOPTS_VECTOR_DELIMITER)) {
        T v;
        parse_value(token, v);
        value.emplace_back(std::move(v));
      }
    }